

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void thumb_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  DisasJumpType *pDVar1;
  DisasJumpType *pDVar2;
  uc_struct *uc;
  TCGContext_conflict1 *tcg_ctx;
  CPUARMState_conflict *env;
  _Bool _Var3;
  _Bool _Var4;
  uint16_t uVar5;
  uint16_t uVar6;
  int iVar7;
  uintptr_t o_4;
  long lVar8;
  ulong uVar9;
  uint32_t target_el;
  DisasJumpType insn;
  target_ulong tVar10;
  uint64_t addr;
  uint uVar11;
  uintptr_t o;
  
  uc = (uc_struct *)dcbase[8].pc_next;
  tcg_ctx = (TCGContext_conflict1 *)uc->tcg_ctx;
  env = (CPUARMState_conflict *)cpu->env_ptr;
  _Var3 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (_Var3) {
    return;
  }
  iVar7 = uc_addr_is_exit(uc,dcbase->pc_next);
  if (iVar7 != 0) {
    dcbase->is_jmp = DISAS_TARGET_2;
    return;
  }
  tVar10 = dcbase->pc_next;
  dcbase[1].pc_first = tVar10;
  uVar5 = arm_lduw_code(env,tVar10,*(int *)((long)&dcbase[2].pc_first + 4) != 0);
  insn = (DisasJumpType)uVar5;
  tVar10 = dcbase->pc_next;
  _Var3 = thumb_insn_is_16bit((DisasContext_conflict1 *)dcbase,(uint32_t)tVar10,insn);
  tVar10 = tVar10 + 2;
  dcbase->pc_next = tVar10;
  if (!_Var3) {
    uVar6 = arm_lduw_code(env,tVar10,*(int *)((long)&dcbase[2].pc_first + 4) != 0);
    insn = CONCAT22(uVar5,uVar6);
    tVar10 = dcbase->pc_next + 2;
    dcbase->pc_next = tVar10;
  }
  dcbase[1].is_jmp = insn;
  iVar7 = *(int *)&dcbase[2].tb;
  if ((iVar7 != 0) && ((insn & 0xffffff00) != 0xbe00)) {
    if ((insn & 0xffffffc0) == 0xba80) {
      if ((dcbase[4].pc_first & 0x8000200) != 0x8000000) {
LAB_005f8110:
        uVar11 = *(uint *)((long)&dcbase[2].tb + 4);
        if (uVar11 < 0xe) {
          arm_skip_unless((DisasContext_conflict1 *)dcbase,uVar11);
          iVar7 = *(int *)&dcbase[2].tb;
          tVar10 = dcbase->pc_next;
        }
      }
    }
    else if ((insn != 0xe97fe97f) || ((~(uint)dcbase[4].pc_first & 0x8000200) != 0))
    goto LAB_005f8110;
  }
  uc->no_exit_request = iVar7 != 0;
  uVar11 = (uint)!_Var3 * 2 + 2;
  addr = tVar10 - uVar11;
  _Var4 = _hook_exists_bounded(uc->hook[2].head,addr);
  if (_Var4) {
    gen_set_pc_im((DisasContext_conflict1 *)dcbase,addr);
    gen_uc_tracecode(tcg_ctx,uVar11,(uint)uc->no_exit_request << 6 | 2,uc,
                     dcbase->pc_next - (ulong)uVar11);
    check_exit_request_aarch64(tcg_ctx);
  }
  if (_Var3) {
    (*(code *)(&DAT_00b834bc + *(int *)(&DAT_00b834bc + (ulong)((insn & 0xffff) >> 0xc) * 4)))();
    return;
  }
  if (((uint)dcbase[4].pc_first & 0x220) == 0x200) {
    lVar8 = 0;
    do {
      if (lVar8 == 0x18) goto LAB_005f8260;
      pDVar1 = (DisasJumpType *)((long)&disas_thumb2_insn_armv6m_mask + lVar8);
      pDVar2 = (DisasJumpType *)((long)&disas_thumb2_insn_armv6m_insn + lVar8);
      lVar8 = lVar8 + 4;
    } while ((*pDVar1 & insn) != *pDVar2);
LAB_005f826d:
    _Var3 = disas_t32((DisasContext_conflict1 *)dcbase,insn);
    if (((_Var3) || (_Var3 = disas_vfp_uncond((DisasContext_conflict1 *)dcbase,insn), _Var3)) ||
       (((insn & 0xf0000000) == 0xe0000000 &&
        (_Var3 = disas_vfp((DisasContext_conflict1 *)dcbase,insn), _Var3)))) goto LAB_005f8c2a;
    uVar11 = insn >> 0x19 & 0xf;
    if (uVar11 < 0x10) {
      if ((0xc0c0U >> uVar11 & 1) == 0) {
        if (uVar11 == 0xc) {
          if ((insn & 0x1100000) == 0x1000000) {
            iVar7 = disas_neon_ls_insn((DisasContext_conflict1 *)dcbase,insn);
            goto LAB_005f8dc0;
          }
        }
        else if ((0xfU >> uVar11 & 1) != 0) {
          abort();
        }
      }
      else {
        uVar11 = (uint)dcbase[4].pc_first;
        if ((uVar11 >> 9 & 1) == 0) {
          if ((uVar11 >> 0x1b & 1) == 0 || (insn & 0xfe000a00) != 0xfc000800) {
            if ((insn & 0xff000a00) == 0xfe000800 && (uVar11 >> 0x1b & 1) != 0) {
              iVar7 = disas_neon_insn_2reg_scalar_ext((DisasContext_conflict1 *)dcbase,insn);
            }
            else if ((~insn & 0x3000000) == 0) {
              iVar7 = disas_neon_data_insn
                                ((DisasContext_conflict1 *)dcbase,
                                 (insn & 0xe2ffffff) + (insn >> 4 & 0x1000000) + 0x10000000);
            }
            else {
              if (((byte)(insn >> 0x1c) & 1) != 0 || (insn & 0xe00) == 0xa00) goto LAB_005f8260;
              iVar7 = disas_coproc_insn((DisasContext_conflict1 *)dcbase,insn);
            }
          }
          else {
            iVar7 = disas_neon_insn_3same_ext((DisasContext_conflict1 *)dcbase,insn);
          }
LAB_005f8dc0:
          if (iVar7 == 0) goto LAB_005f8c2a;
        }
        else if (((~insn & 0x3000000) != 0) &&
                (((insn & 0xe00) != 0xa00 || (((ulong)(dcbase[1].tb)->orig_tb & 0xf0) == 0)))) {
          if ((dcbase[2].is_jmp == 0x17) && (*(char *)((long)&dcbase[3].tb + 4) != '\0')) {
            target_el = 3;
          }
          else {
            target_el = 1;
            if (1 < dcbase[3].max_insns) {
              target_el = dcbase[3].max_insns;
            }
          }
          gen_exception_insn((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase[1].pc_first,0x11,
                             0x2000000,target_el);
          goto LAB_005f8c2a;
        }
      }
    }
  }
  else if ((insn & 0xf800e800) == 0xf000e800 || (dcbase[4].pc_first & 0x40) != 0) goto LAB_005f826d;
LAB_005f8260:
  unallocated_encoding_aarch64((DisasContext_conflict1 *)dcbase);
LAB_005f8c2a:
  uVar11 = *(uint *)&dcbase[2].tb;
  if (uVar11 != 0) {
    *(uint *)((long)&dcbase[2].tb + 4) = uVar11 >> 4 & 1 | *(uint *)((long)&dcbase[2].tb + 4) & 0xe;
    uVar11 = uVar11 * 2 & 0x1e;
    *(uint *)&dcbase[2].tb = uVar11;
    if (uVar11 == 0) {
      *(undefined4 *)((long)&dcbase[2].tb + 4) = 0;
    }
  }
  arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
  if (dcbase->is_jmp != DISAS_NEXT) {
    return;
  }
  uVar9 = dcbase->pc_next - dcbase[1].pc_next;
  iVar7 = (int)*(undefined8 *)&uc->init_target_page->mask;
  if (uVar9 < (ulong)(long)-iVar7) {
    if (uVar9 < (ulong)(long)(-3 - iVar7)) {
      return;
    }
    uVar5 = arm_lduw_code(env,dcbase->pc_next,*(int *)((long)&dcbase[2].pc_first + 4) != 0);
    _Var3 = thumb_insn_is_16bit((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase->pc_next,
                                (uint)uVar5);
    if (_Var3) {
      return;
    }
  }
  dcbase->is_jmp = DISAS_TOO_MANY;
  return;
}

Assistant:

static void thumb_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    struct uc_struct *uc = dc->uc;
    TCGContext *tcg_ctx = uc->tcg_ctx;
    CPUARMState *env = cpu->env_ptr;
    uint32_t insn;
    bool is_16bit;
    uint32_t insn_size;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
        return;
    }

    dc->pc_curr = dc->base.pc_next;
    insn = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);
    is_16bit = thumb_insn_is_16bit(dc, dc->base.pc_next, insn);
    dc->base.pc_next += 2;
    if (!is_16bit) {
        uint32_t insn2 = arm_lduw_code(env, dc->base.pc_next, dc->sctlr_b);

        insn = insn << 16 | insn2;
        dc->base.pc_next += 2;
    }
    dc->insn = insn;

    if (dc->condexec_mask && !thumb_insn_is_unconditional(dc, insn)) {
        uint32_t cond = dc->condexec_cond;

        /*
         * Conditionally skip the insn. Note that both 0xe and 0xf mean
         * "always"; 0xf is not "never".
         */
        if (cond < 0x0e) {
            arm_skip_unless(dc, cond);
        }
    }
    
    // Unicorn:
    //   We can't stop in the middle of the IT block.
    //   In other words, treat the whole IT block as
    //   a single instruction.
    uc->no_exit_request = (dc->condexec_mask != 0);

    // Unicorn: trace this instruction on request
    insn_size = is_16bit ? 2 : 4;
    if (HOOK_EXISTS_BOUNDED(uc, UC_HOOK_CODE, dc->base.pc_next - insn_size)) {
        
        // Sync PC in advance
        gen_set_pc_im(dc, dc->base.pc_next - insn_size);

        if (uc->no_exit_request) {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX | UC_HOOK_FLAG_NO_STOP, uc, dc->base.pc_next - insn_size);
        } else {
            gen_uc_tracecode(tcg_ctx, insn_size, UC_HOOK_CODE_IDX, uc, dc->base.pc_next - insn_size);
        }
        // the callback might want to stop emulation immediately
        check_exit_request(tcg_ctx);
    }

    if (is_16bit) {
        disas_thumb_insn(dc, insn);
    } else {
        disas_thumb2_insn(dc, insn);
    }

    /* Advance the Thumb condexec condition.  */
    if (dc->condexec_mask) {
        dc->condexec_cond = ((dc->condexec_cond & 0xe) |
                             ((dc->condexec_mask >> 4) & 1));
        dc->condexec_mask = (dc->condexec_mask << 1) & 0x1f;
        if (dc->condexec_mask == 0) {
            dc->condexec_cond = 0;
        }
    }

    arm_post_translate_insn(dc);

    /* Thumb is a variable-length ISA.  Stop translation when the next insn
     * will touch a new page.  This ensures that prefetch aborts occur at
     * the right place.
     *
     * We want to stop the TB if the next insn starts in a new page,
     * or if it spans between this page and the next. This means that
     * if we're looking at the last halfword in the page we need to
     * see if it's a 16-bit Thumb insn (which will fit in this TB)
     * or a 32-bit Thumb insn (which won't).
     * This is to avoid generating a silly TB with a single 16-bit insn
     * in it at the end of this page (which would execute correctly
     * but isn't very efficient).
     */
    if (dc->base.is_jmp == DISAS_NEXT
        && (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE
            || (dc->base.pc_next - dc->page_start >= TARGET_PAGE_SIZE - 3
                && insn_crosses_page(env, dc)))) {
        dc->base.is_jmp = DISAS_TOO_MANY;
    }
}